

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# N.cpp
# Opt level: O3

nodeit * __thiscall N::operator[](nodeit *__return_storage_ptr__,N *this,nodeit ps_)

{
  CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N> *pCVar1;
  N **ppNVar2;
  pointer ppNVar3;
  __normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_> _Var4;
  int iVar5;
  nodeit *pnVar7;
  __normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_> _Var8;
  CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N> *pCVar9;
  __normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_> _Var10;
  __normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_> _Var11;
  nodeit *pnVar12;
  nodeit local_50;
  long lVar6;
  
  _Var8._M_current = ps_._start._M_current;
  _Var11._M_current = ps_._end._M_current;
  lVar6 = (long)ps_._end._M_current - (long)ps_._start._M_current >> 3;
  iVar5 = (int)lVar6;
  pCVar9 = ps_.next;
  for (pCVar1 = ps_.next;
      pCVar1 != (CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>
                 *)0x0; pCVar1 = pCVar1->next) {
    lVar6 = lVar6 + ((long)(pCVar1->_end)._M_current - (long)(pCVar1->_start)._M_current >> 3);
    iVar5 = (int)lVar6;
  }
  if (iVar5 == 0) {
    ppNVar3 = (this->os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->_start)._M_current = ppNVar3;
    (__return_storage_ptr__->_end)._M_current = ppNVar3;
    (__return_storage_ptr__->_curr)._M_current = ppNVar3;
    __return_storage_ptr__->next =
         (CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N> *)0x0;
  }
  else {
    operator[](__return_storage_ptr__,this,*ps_._start._M_current);
    pCVar1 = &ps_;
    do {
      pnVar12 = pCVar1;
      pCVar1 = pnVar12->next;
    } while (pCVar1 != (CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>
                        *)0x0);
    ppNVar2 = (pnVar12->_end)._M_current;
    _Var10._M_current = _Var8._M_current;
    pnVar12 = __return_storage_ptr__;
    if (ppNVar2 != _Var8._M_current ||
        pCVar9 != (CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>
                   *)0x0) {
      do {
        pnVar7 = pnVar12;
        if (*_Var10._M_current != *_Var8._M_current) {
          operator[](&local_50,this,*_Var10._M_current);
          _Var4._M_current = local_50._end._M_current;
          _Var8._M_current = local_50._start._M_current;
          pnVar7 = (nodeit *)::operator_new(0x20);
          (pnVar7->_start)._M_current = _Var8._M_current;
          (pnVar7->_end)._M_current = _Var4._M_current;
          (pnVar7->_curr)._M_current = _Var8._M_current;
          pnVar7->next = (CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>
                          *)0x0;
          pnVar12->next = pnVar7;
          _Var8 = ps_._start;
        }
        _Var10._M_current = _Var10._M_current + 1;
        if ((pCVar9 != (CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>
                        *)0x0) && (_Var10._M_current == _Var11._M_current)) {
          _Var11._M_current = (pCVar9->_end)._M_current;
          _Var10._M_current = (pCVar9->_curr)._M_current;
          pCVar9 = pCVar9->next;
        }
        pnVar12 = pnVar7;
      } while (_Var10._M_current != ppNVar2 ||
               pCVar9 != (CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>
                          *)0x0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

nodeit N::operator[](nodeit ps_) {
    if (ps_.size() == 0) return nodeit(os.end(), os.end());

    auto start_it = (*this)[*ps_.begin()];

    auto last = &start_it;
    for (auto p : ps_)
        if (p != *ps_.begin())
            last = last->chain((*this)[p]);

    return start_it;
}